

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O2

void __thiscall rw::ps2::MatPipeline::dump(MatPipeline *this)

{
  PipeAttribute *pPVar1;
  uint i;
  ulong uVar2;
  
  if ((this->super_Pipeline).platform == 4) {
    printf("%x %x\n",(ulong)(this->super_Pipeline).pluginID,(ulong)(this->super_Pipeline).pluginData
          );
    for (uVar2 = 0; uVar2 != 10; uVar2 = uVar2 + 1) {
      pPVar1 = this->attribs[uVar2];
      if (pPVar1 != (PipeAttribute *)0x0) {
        printf("%d %s: %x\n",uVar2 & 0xffffffff,pPVar1->name,(ulong)pPVar1->attrib);
      }
    }
    printf("stride: %x\n",(ulong)this->inputStride);
    printf("vertcount: %x\n",(ulong)this->vifOffset / (ulong)this->inputStride,
           (ulong)this->vifOffset % (ulong)this->inputStride);
    printf("triSCount: %x\n",(ulong)this->triStripCount);
    printf("triLCount: %x\n",(ulong)this->triListCount);
    printf("vifOffset: %x\n",(ulong)this->vifOffset);
    putchar(10);
    return;
  }
  return;
}

Assistant:

void
MatPipeline::dump(void)
{
	if(this->platform != PLATFORM_PS2)
		return;
	PipeAttribute *a;
	printf("%x %x\n", this->pluginID, this->pluginData);
	for(uint i = 0; i < nelem(this->attribs); i++){
		a = this->attribs[i];
		if(a)
			printf("%d %s: %x\n", i, a->name, a->attrib);
	}
	printf("stride: %x\n", this->inputStride);
	printf("vertcount: %x\n", this->vifOffset/this->inputStride);
	printf("triSCount: %x\n", this->triStripCount);
	printf("triLCount: %x\n", this->triListCount);
	printf("vifOffset: %x\n", this->vifOffset);
	printf("\n");
}